

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_compile_trailers(curl_slist *trailers,Curl_send_buffer *buffer,Curl_easy *handle)

{
  char *__s;
  CURLcode CVar1;
  char *pcVar2;
  char *inptr;
  Curl_send_buffer *buffer_local;
  ulong local_38;
  
  local_38 = *(ulong *)&(handle->set).field_0x878;
  inptr = "\n";
  buffer_local = buffer;
  if ((local_38 & 0x840) == 0) {
    inptr = "\r\n";
  }
  do {
    if (trailers == (curl_slist *)0x0) {
      CVar1 = Curl_add_buffer(&buffer_local,inptr,(ulong)((local_38 & 0x840) == 0) + 1);
      return CVar1;
    }
    __s = trailers->data;
    pcVar2 = strchr(__s,0x3a);
    if ((pcVar2 == (char *)0x0) || (pcVar2[1] != ' ')) {
      Curl_infof(handle,"Malformatted trailing header ! Skipping trailer.");
    }
    else {
      CVar1 = Curl_add_bufferf(&buffer_local,"%s%s",__s,inptr);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
    }
    trailers = trailers->next;
  } while( true );
}

Assistant:

CURLcode Curl_http_compile_trailers(struct curl_slist *trailers,
                                    Curl_send_buffer *buffer,
                                    struct Curl_easy *handle)
{
  char *ptr = NULL;
  CURLcode result = CURLE_OK;
  const char *endofline_native = NULL;
  const char *endofline_network = NULL;

  if(
#ifdef CURL_DO_LINEEND_CONV
     (handle->set.prefer_ascii) ||
#endif
     (handle->set.crlf)) {
    /* \n will become \r\n later on */
    endofline_native  = "\n";
    endofline_network = "\x0a";
  }
  else {
    endofline_native  = "\r\n";
    endofline_network = "\x0d\x0a";
  }

  while(trailers) {
    /* only add correctly formatted trailers */
    ptr = strchr(trailers->data, ':');
    if(ptr && *(ptr + 1) == ' ') {
      result = Curl_add_bufferf(&buffer, "%s%s", trailers->data,
                                endofline_native);
      if(result)
        return result;
    }
    else
      infof(handle, "Malformatted trailing header ! Skipping trailer.");
    trailers = trailers->next;
  }
  result = Curl_add_buffer(&buffer, endofline_network,
                           strlen(endofline_network));
  return result;
}